

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CConvertVisitor.cpp
# Opt level: O0

void __thiscall CConvertVisitor::Visit(CConvertVisitor *this,CPrintStm *stm)

{
  bool bVar1;
  pointer pIVar2;
  CPrintStm *stm_local;
  CConvertVisitor *this_local;
  
  std::__cxx11::string::operator+=((string *)&this->code,"System.out.println(");
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&stm->expression);
  if (bVar1) {
    pIVar2 = std::unique_ptr<IExpression,_std::default_delete<IExpression>_>::operator->
                       (&stm->expression);
    (**(pIVar2->super_PositionedNode).super_INode._vptr_INode)(pIVar2,this);
  }
  std::__cxx11::string::operator+=((string *)&this->code,");\n");
  return;
}

Assistant:

void CConvertVisitor::Visit(CPrintStm &stm) {

	this->code += "System.out.println(";
	if (stm.expression) {
		stm.expression->Accept(*this);
	}
	this->code += ");\n";

}